

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

idx_t duckdb::TemplatedMatch<false,unsigned_short,duckdb::DistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  long lVar7;
  sel_t *psVar8;
  bool bVar9;
  uint uVar10;
  const_reference pvVar11;
  idx_t i_1;
  idx_t iVar12;
  uint uVar13;
  idx_t iVar14;
  idx_t match_count;
  idx_t iVar15;
  idx_t i;
  idx_t iVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  long local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar11 = vector<unsigned_long,_true>::get<true>(&rhs_layout->offsets,col_idx);
  uVar13 = 1 << ((byte)col_idx & 7);
  vVar5 = *pvVar11;
  if (puVar1 == (unsigned_long *)0x0) {
    iVar15 = 0;
    for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
      psVar6 = sel->sel_vector;
      iVar14 = iVar16;
      if (psVar6 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar6[iVar16];
      }
      psVar8 = pSVar2->sel_vector;
      iVar12 = iVar14;
      if (psVar8 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar8[iVar14];
      }
      lVar7 = *(long *)(pdVar4 + iVar14 * 8);
      local_38 = ((long)(rhs_layout->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(rhs_layout->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (((uVar13 & *(byte *)(lVar7 + (col_idx >> 3))) == 0) ||
         (*(short *)(pdVar3 + iVar12 * 2) != *(short *)(lVar7 + vVar5))) {
        psVar6[iVar15] = (sel_t)iVar14;
        iVar15 = iVar15 + 1;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
    }
  }
  else {
    iVar15 = 0;
    for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
      iVar14 = iVar16;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar14 = (idx_t)sel->sel_vector[iVar16];
      }
      psVar6 = pSVar2->sel_vector;
      iVar12 = iVar14;
      if (psVar6 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar6[iVar14];
      }
      bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>,
                         iVar12);
      lVar7 = *(long *)(pdVar4 + iVar14 * 8);
      local_38 = ((long)(rhs_layout->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(rhs_layout->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uVar10 = (uint)*(byte *)(lVar7 + (col_idx >> 3));
      if (((uVar13 & uVar10) == 0) || (!bVar9)) {
        if (((uVar13 & uVar10) == 0) != !bVar9) goto LAB_0192175c;
      }
      else if (*(short *)(pdVar3 + iVar12 * 2) != *(short *)(lVar7 + vVar5)) {
LAB_0192175c:
        sel->sel_vector[iVar15] = (sel_t)iVar14;
        iVar15 = iVar15 + 1;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
    }
  }
  return iVar15;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}